

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButton(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
                       int frame_padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  int in_R8D;
  ImVec2 padding;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_00000060;
  ImTextureID in_stack_00000068;
  ImVec4 *in_stack_00000080;
  ImVec4 *in_stack_00000088;
  float local_54;
  float in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ImGuiWindow *str;
  ImGuiContext *this;
  bool local_1;
  
  str = GImGui->CurrentWindow;
  if ((str->SkipItems & 1U) == 0) {
    this = GImGui;
    PushID((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    ImGuiWindow::GetID((ImGuiWindow *)this,(char *)str,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    PopID();
    if (in_R8D < 0) {
      local_54 = (this->Style).FramePadding.x;
    }
    else {
      ImVec2::ImVec2((ImVec2 *)&local_54,(float)in_R8D,(float)in_R8D);
    }
    local_1 = ImageButtonEx((ImGuiID)tint_col,in_stack_00000068,in_stack_00000060,
                            (ImVec2 *)user_texture_id,size,uv0,in_stack_00000080,in_stack_00000088);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ImageButton(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, int frame_padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    // Default to using texture ID as ID. User can still push string/integer prefixes.
    PushID((void*)(intptr_t)user_texture_id);
    const ImGuiID id = window->GetID("#image");
    PopID();

    const ImVec2 padding = (frame_padding >= 0) ? ImVec2((float)frame_padding, (float)frame_padding) : g.Style.FramePadding;
    return ImageButtonEx(id, user_texture_id, size, uv0, uv1, padding, bg_col, tint_col);
}